

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

fctcl_t * fct_clp__get_clo(fct_clp_t *clp,char *option)

{
  int iVar1;
  size_t sVar2;
  fctcl_t *clo;
  fctcl_t *pclo;
  size_t num_itemspclo;
  size_t item_ipclo;
  fctcl_t *found;
  char *option_local;
  fct_clp_t *clp_local;
  
  if (clp != (fct_clp_t *)0x0) {
    sVar2 = fct_nlist__size(&clp->clo_list);
    for (num_itemspclo = 0; num_itemspclo != sVar2; num_itemspclo = num_itemspclo + 1) {
      clo = (fctcl_t *)fct_nlist__at(&clp->clo_list,num_itemspclo);
      iVar1 = fctcl__is_option(clo,option);
      if (iVar1 != 0) {
        return clo;
      }
    }
  }
  return (fctcl_t *)0x0;
}

Assistant:

static fctcl_t const*
fct_clp__get_clo(fct_clp_t const *clp, char const *option)
{
    fctcl_t const *found =NULL;

    FCT_NLIST_FOREACH_BGN(fctcl_t const*, pclo, &(clp->clo_list))
    {
        if ( fctcl__is_option(pclo, option) )
        {
            found = pclo;
            break;
        }
    }
    FCT_NLIST_FOREACH_END();
    return found;
}